

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O3

void * c4::aalloc(size_t sz,size_t alignment)

{
  code *UNRECOVERED_JUMPTABLE;
  void *pvVar1;
  undefined8 local_20;
  
  UNRECOVERED_JUMPTABLE = (code *)detail::s_aalloc;
  if (detail::s_aalloc == (undefined *)0x0) {
    aalloc();
    UNRECOVERED_JUMPTABLE = local_20;
  }
  pvVar1 = (void *)(*UNRECOVERED_JUMPTABLE)(sz,alignment);
  return pvVar1;
}

Assistant:

void* aalloc(size_t sz, size_t alignment)
{
    C4_ASSERT_MSG(c4::get_aalloc() != nullptr, "did you forget to call set_aalloc()?");
    auto fn = c4::get_aalloc();
    void* ptr = fn(sz, alignment);
    return ptr;
}